

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtrie.c
# Opt level: O2

void yatrie_get_word_nodes(word_nodes_s *res,uint8_t *word,uint32_t parent_id,trie_s *trie)

{
  nodes_s *pnVar1;
  byte bVar2;
  ulong uVar3;
  uint uVar4;
  nodes_s *bitmask;
  uint8_t uVar5;
  ulong uVar6;
  undefined1 auStack_98 [8];
  uint8_t indexes [96];
  
  indexes._24_32_ = ZEXT1632(ZEXT816(0) << 0x40);
  _auStack_98 = ZEXT1632(ZEXT816(0) << 0x40);
  indexes._56_32_ = indexes._24_32_;
  encode_string(auStack_98,word);
  pnVar1 = trie->nodes;
  uVar5 = auStack_98[0];
  indexes._88_8_ = pnVar1;
  bVar2 = bit_int32_count(&pnVar1[(ulong)parent_id * 2 + 1].increment,'\x01',auStack_98[0] + 0xff);
  uVar3 = (ulong)(&trie->refs[1].increment)[(uint)bVar2 + pnVar1[(ulong)parent_id * 2 + 2].size];
  pnVar1 = (nodes_s *)(indexes._88_8_ + uVar3 * 0x10);
  uVar6 = 1;
  while( true ) {
    bitmask = pnVar1 + 1;
    if (uVar5 == '\0') {
      return;
    }
    uVar4 = (int)uVar6 - 1;
    res->letters[uVar4] = -((bitmask->increment & 1) == 0) | 1;
    res->length = res->length + '\x01';
    res->nodes[uVar4] = (uint32_t)uVar3;
    bVar2 = auStack_98[uVar6];
    uVar4 = (uint)bVar2;
    if ((bVar2 & 0x1f) == 0) {
      bVar2 = 0;
    }
    if (((&bitmask->increment)[(int)(uVar4 - 1) >> 5] >> ((byte)(bVar2 - 1) & 0x1f) & 1) == 0)
    break;
    bVar2 = bit_int32_count(&bitmask->increment,'\x01',(uint8_t)(uVar4 - 1));
    uVar3 = (ulong)(&trie->refs[1].increment)[(uint)bVar2 + pnVar1[2].size];
    pnVar1 = trie->nodes + uVar3 * 2;
    uVar5 = auStack_98[uVar6];
    uVar6 = (ulong)((int)uVar6 + 1);
  }
  return;
}

Assistant:

void yatrie_get_word_nodes(word_nodes_s *res, uint8_t *word, uint32_t parent_id, trie_s *trie) {
    uint8_t indexes[MASK_BITS] = {}; //array to store bitmask
    uint32_t i = 0;
    uint8_t pos = 0;

    encode_string(indexes, word);
    node_s *parent_node = NODE_GET(parent_id, trie);

    //first node
    pos = bit_int32_count(parent_node->mask, 1, indexes[i++] - 1);
    parent_id = REF_GET(parent_node->ref_id, pos, trie);
    parent_node = NODE_GET(parent_id, trie);

    //cycle starts from the second node
    for (uint32_t j = 0; indexes[j]; ++i, ++j) {

        if(IS_LEAF(parent_node)){
            res->letters[j] = 1;
        } else {
            res->letters[j] = -1;
        }
        ++res->length;
        res->nodes[j] = parent_id;

        //if char exists in the bitmask we need to get next node_s id from the references block
        if (LIKELY(BIT_ARRAY_GET(parent_node->mask, indexes[i]))) {
            //number of chars (bits) before the current char (bit) position in the alphabet
            //count the number of bits before char to determine its position
            pos = bit_int32_count(parent_node->mask, 1, indexes[i] - 1);
            parent_id = REF_GET(parent_node->ref_id, pos, trie);
            parent_node = NODE_GET(parent_id, trie);
        } else {
            return;
        }

    }
    return;
}